

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O1

void __thiscall duckdb::ZSTDCompressionState::FlushVector(ZSTDCompressionState *this)

{
  atomic<unsigned_long> *paVar1;
  idx_t iVar2;
  pointer pCVar3;
  
  this->page_ids[this->vector_in_segment_count] = this->starting_page;
  iVar2 = this->vector_in_segment_count;
  this->page_offsets[iVar2] = this->starting_offset;
  this->compressed_sizes[iVar2] = this->compressed_size;
  this->uncompressed_sizes[this->vector_in_segment_count] = this->uncompressed_size;
  this->vector_count = this->vector_count + 1;
  this->vector_in_segment_count = this->vector_in_segment_count + 1;
  this->in_vector = false;
  iVar2 = this->tuple_count;
  pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(&this->segment);
  LOCK();
  paVar1 = &(pCVar3->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + iVar2;
  UNLOCK();
  this->tuple_count = 0;
  if (this->vector_count == this->total_vector_count) {
    optional_ptr<duckdb::BufferHandle,_true>::CheckValid(&this->current_buffer);
    FlushPage(this,(this->current_buffer).ptr,this->block_id);
    if (this->starting_page != this->block_id) {
LAB_0057fa55:
      optional_ptr<duckdb::BufferHandle,_true>::CheckValid(&this->vector_lengths_buffer);
      FlushPage(this,(this->vector_lengths_buffer).ptr,this->starting_page);
      return;
    }
  }
  else if ((this->vector_lengths_buffer).ptr != (this->current_buffer).ptr) goto LAB_0057fa55;
  return;
}

Assistant:

void FlushVector() {
		// Write the metadata for this Vector
		page_ids[vector_in_segment_count] = starting_page;
		page_offsets[vector_in_segment_count] = starting_offset;
		compressed_sizes[vector_in_segment_count] = compressed_size;
		uncompressed_sizes[vector_in_segment_count] = uncompressed_size;
		vector_count++;
		vector_in_segment_count++;
		in_vector = false;
		segment->count += tuple_count;

		const bool is_last_vector = vector_count == total_vector_count;
		tuple_count = 0;
		if (is_last_vector) {
			FlushPage(*current_buffer, block_id);
			if (starting_page != block_id) {
				FlushPage(*vector_lengths_buffer, starting_page);
			}
		} else {
			if (vector_lengths_buffer == current_buffer) {
				// We did not cross a page boundary writing this vector
				return;
			}
			// Flush the page that holds the vector lengths
			FlushPage(*vector_lengths_buffer, starting_page);
		}
	}